

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O3

Sector * GetTypicalSector(Sector *__return_storage_ptr__,CylHead *cylhead,Track *track,Sector *last)

{
  int *piVar1;
  int iVar2;
  pointer pSVar3;
  Encoding EVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  Sector *pSVar11;
  int *piVar12;
  pointer pSVar13;
  int *piVar14;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> heads;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> cyls;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> sizes;
  map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  encodings;
  map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  datarates;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> gap3s;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_150;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_120;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_f0;
  _Rb_tree<Encoding,_std::pair<const_Encoding,_int>,_std::_Select1st<std::pair<const_Encoding,_int>_>,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  local_c0;
  _Rb_tree<DataRate,_std::pair<const_DataRate,_int>,_std::_Select1st<std::pair<const_DataRate,_int>_>,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_150._M_impl.super__Rb_tree_header._M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->gap3 + 3) = *(undefined4 *)((long)&last->gap3 + 3);
  iVar6 = (last->header).cyl;
  iVar7 = (last->header).head;
  iVar8 = (last->header).sector;
  iVar9 = (last->header).size;
  EVar4 = last->encoding;
  iVar2 = last->offset;
  iVar5 = last->gap3;
  __return_storage_ptr__->datarate = last->datarate;
  __return_storage_ptr__->encoding = EVar4;
  __return_storage_ptr__->offset = iVar2;
  __return_storage_ptr__->gap3 = iVar5;
  (__return_storage_ptr__->header).cyl = iVar6;
  (__return_storage_ptr__->header).head = iVar7;
  (__return_storage_ptr__->header).sector = iVar8;
  (__return_storage_ptr__->header).size = iVar9;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right =
       local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<Data,_std::allocator<Data>_>::vector(&__return_storage_ptr__->m_data,&last->m_data);
  pSVar13 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar3 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar13 != pSVar3) {
    piVar1 = &(__return_storage_ptr__->header).head;
    piVar14 = &(__return_storage_ptr__->header).size;
    piVar12 = &pSVar13->gap3;
    do {
      pmVar10 = std::
                map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                              *)&local_90,(key_type *)(piVar12 + -3));
      iVar2 = *pmVar10;
      *pmVar10 = iVar2 + 1;
      pmVar10 = std::
                map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                              *)&local_90,&__return_storage_ptr__->datarate);
      if (*pmVar10 <= iVar2) {
        __return_storage_ptr__->datarate = piVar12[-3];
      }
      pmVar10 = std::
                map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                              *)&local_c0,(key_type *)(piVar12 + -2));
      iVar2 = *pmVar10;
      *pmVar10 = iVar2 + 1;
      pmVar10 = std::
                map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                              *)&local_c0,&__return_storage_ptr__->encoding);
      if (*pmVar10 <= iVar2) {
        __return_storage_ptr__->encoding = piVar12[-2];
      }
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_120,(key_type *)(piVar12 + -7));
      iVar2 = *pmVar10;
      *pmVar10 = iVar2 + 1;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_120,(key_type *)__return_storage_ptr__);
      if (*pmVar10 <= iVar2) {
        (__return_storage_ptr__->header).cyl = (((Sector *)(piVar12 + -7))->header).cyl;
      }
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_150,piVar12 + -6);
      iVar2 = *pmVar10;
      *pmVar10 = iVar2 + 1;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_150,piVar1);
      if (*pmVar10 <= iVar2) {
        *piVar1 = piVar12[-6];
      }
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_f0,piVar12 + -4);
      iVar2 = *pmVar10;
      *pmVar10 = iVar2 + 1;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_f0,piVar14);
      if (*pmVar10 <= iVar2) {
        *piVar14 = piVar12[-4];
      }
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_60,piVar12);
      iVar2 = *pmVar10;
      *pmVar10 = iVar2 + 1;
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_60,&__return_storage_ptr__->gap3);
      if (*pmVar10 <= iVar2) {
        __return_storage_ptr__->gap3 = *piVar12;
      }
      pSVar13 = (pointer)(piVar12 + 9);
      piVar12 = piVar12 + 0x10;
    } while (pSVar13 != pSVar3);
  }
  pmVar10 = std::
            map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
            ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                          *)&local_90,&__return_storage_ptr__->datarate);
  iVar2 = *pmVar10;
  pmVar10 = std::
            map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
            ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                          *)&local_90,&last->datarate);
  if (iVar2 == *pmVar10) {
    __return_storage_ptr__->datarate = last->datarate;
  }
  pmVar10 = std::
            map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
            ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                          *)&local_c0,&__return_storage_ptr__->encoding);
  iVar2 = *pmVar10;
  pmVar10 = std::
            map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
            ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                          *)&local_c0,&last->encoding);
  if (iVar2 == *pmVar10) {
    __return_storage_ptr__->encoding = last->encoding;
  }
  pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_120,(key_type *)__return_storage_ptr__);
  iVar2 = *pmVar10;
  pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_120,&cylhead->cyl);
  pSVar11 = (Sector *)cylhead;
  if (iVar2 == *pmVar10) {
LAB_0015a3e4:
    (__return_storage_ptr__->header).cyl = (pSVar11->header).cyl;
  }
  else {
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_120,(key_type *)__return_storage_ptr__);
    iVar2 = *pmVar10;
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_120,(key_type *)last);
    pSVar11 = last;
    if ((iVar2 == *pmVar10) ||
       (pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_120,(key_type *)__return_storage_ptr__),
       pSVar11 = (Sector *)cylhead, *pmVar10 == 1)) goto LAB_0015a3e4;
  }
  piVar1 = &(__return_storage_ptr__->header).head;
  pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_150,piVar1);
  iVar2 = *pmVar10;
  piVar12 = &cylhead->head;
  pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_150,piVar12);
  piVar14 = piVar12;
  if (iVar2 != *pmVar10) {
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_150,piVar1);
    iVar2 = *pmVar10;
    piVar14 = &(last->header).head;
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_150,piVar14);
    if ((iVar2 != *pmVar10) &&
       (pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_150,piVar1), piVar14 = piVar12, *pmVar10 != 1))
    goto LAB_0015a45b;
  }
  *piVar1 = *piVar14;
LAB_0015a45b:
  piVar1 = &(__return_storage_ptr__->header).size;
  pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_f0,piVar1);
  iVar2 = *pmVar10;
  piVar14 = &(last->header).size;
  pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&local_f0,piVar14);
  if (iVar2 == *pmVar10) {
    *piVar1 = *piVar14;
  }
  if (last->gap3 != 0) {
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_60,&last->gap3);
    if ((*pmVar10 != 0) || (__return_storage_ptr__->gap3 == 0)) {
      __return_storage_ptr__->gap3 = last->gap3;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_150);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<Encoding,_std::pair<const_Encoding,_int>,_std::_Select1st<std::pair<const_Encoding,_int>_>,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<DataRate,_std::pair<const_DataRate,_int>,_std::_Select1st<std::pair<const_DataRate,_int>_>,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  ::~_Rb_tree(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Sector GetTypicalSector(const CylHead& cylhead, const Track& track, const Sector& last)
{
    std::map<DataRate, int> datarates;
    std::map<Encoding, int> encodings;
    std::map<int, int> cyls, heads, sizes, gap3s;

    Sector typical = last;

    // Find the most common values
    for (const auto& sector : track)
    {
        if (++datarates[sector.datarate] > datarates[typical.datarate])
            typical.datarate = sector.datarate;

        if (++encodings[sector.encoding] > encodings[typical.encoding])
            typical.encoding = sector.encoding;

        if (++cyls[sector.header.cyl] > cyls[typical.header.cyl])
            typical.header.cyl = sector.header.cyl;

        if (++heads[sector.header.head] > heads[typical.header.head])
            typical.header.head = sector.header.head;

        if (++sizes[sector.header.size] > sizes[typical.header.size])
            typical.header.size = sector.header.size;

        if (++gap3s[sector.gap3] > gap3s[typical.gap3])
            typical.gap3 = sector.gap3;
    }

    // Use the previous values if the typical values are no better,
    // except for cyl and head where we favour the physical position
    // and prevent a single different sector changing the values.

    if (datarates[typical.datarate] == datarates[last.datarate])
        typical.datarate = last.datarate;

    if (encodings[typical.encoding] == encodings[last.encoding])
        typical.encoding = last.encoding;

    if (cyls[typical.header.cyl] == cyls[cylhead.cyl])
        typical.header.cyl = cylhead.cyl;
    else if (cyls[typical.header.cyl] == cyls[last.header.cyl])
        typical.header.cyl = last.header.cyl;
    else if (cyls[typical.header.cyl] == 1)
        typical.header.cyl = cylhead.cyl;

    if (heads[typical.header.head] == heads[cylhead.head])
        typical.header.head = cylhead.head;
    else if (heads[typical.header.head] == heads[last.header.head])
        typical.header.head = last.header.head;
    else if (heads[typical.header.head] == 1)
        typical.header.head = cylhead.head;

    if (sizes[typical.header.size] == sizes[last.header.size])
        typical.header.size = last.header.size;

    // Use previous gap3 if still present, or if no new gap3 was found.
    if (last.gap3 && (gap3s[last.gap3] || !typical.gap3))
        typical.gap3 = last.gap3;

    return typical;
}